

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setCheckBox(QMessageBox *this,QCheckBox *cb)

{
  long lVar1;
  QMessageBoxPrivate *pQVar2;
  QWidget *pQVar3;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  QSizePolicy sp;
  QMessageBoxPrivate *in_stack_000000d0;
  QWidget *parent;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  undefined4 in_stack_fffffffffffffff0;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parent = in_RDI;
  pQVar2 = d_func((QMessageBox *)0x7a56df);
  if (in_RSI != (QWidget *)pQVar2->checkbox) {
    if (pQVar2->checkbox != (QCheckBox *)0x0) {
      QWidget::hide((QWidget *)0x7a571c);
      QWidget::layout((QWidget *)0x7a5726);
      QLayout::removeWidget((QLayout *)parent,in_RSI);
      pQVar3 = QWidget::parentWidget((QWidget *)0x7a574b);
      if (pQVar3 == in_RDI) {
        QWidget::setParent((QWidget *)
                           CONCAT44(in_stack_fffffffffffffff4.data,in_stack_fffffffffffffff0),parent
                          );
        QObject::deleteLater();
      }
    }
    policy.data = (quint32)((ulong)parent >> 0x20);
    pQVar2->checkbox = (QCheckBox *)in_RSI;
    if (pQVar2->checkbox != (QCheckBox *)0x0) {
      QWidget::sizePolicy(in_RDI);
      QSizePolicy::setHorizontalPolicy((QSizePolicy *)&stack0xfffffffffffffff4,MinimumExpanding);
      QWidget::setSizePolicy(in_RSI,(QSizePolicy)policy);
    }
    QMessageBoxPrivate::setupLayout(in_stack_000000d0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::setCheckBox(QCheckBox *cb)
{
    Q_D(QMessageBox);

    if (cb == d->checkbox)
        return;

    if (d->checkbox) {
        d->checkbox->hide();
        layout()->removeWidget(d->checkbox);
        if (d->checkbox->parentWidget() == this) {
            d->checkbox->setParent(nullptr);
            d->checkbox->deleteLater();
        }
    }
    d->checkbox = cb;
    if (d->checkbox) {
        QSizePolicy sp = d->checkbox->sizePolicy();
        sp.setHorizontalPolicy(QSizePolicy::MinimumExpanding);
        d->checkbox->setSizePolicy(sp);
    }
    d->setupLayout();
}